

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_cobs.c
# Opt level: O0

ssize_t mpt_encode_cobs(mpt_encode_state *info,iovec *cobs,iovec *base)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  byte *pbVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  void *pvStack_68;
  uint8_t curr;
  ssize_t pos;
  iovec tmp;
  size_t len;
  size_t left;
  byte *pbStack_38;
  uint8_t code;
  uint8_t *dst;
  uint8_t *src;
  iovec *base_local;
  iovec *cobs_local;
  mpt_encode_state *info_local;
  
  if (cobs == (iovec *)0x0) {
    info->_ctx = 0;
    info->done = 0;
    info->scratch = 0;
    info_local = (mpt_encode_state *)0x0;
  }
  else {
    uVar1 = info->scratch;
    left._7_1_ = (byte)uVar1;
    uVar2 = info->done;
    uVar7 = cobs->iov_len;
    if (cobs->iov_base == (void *)0x0) {
      if (((left._7_1_ == 0) && (uVar2 == 0)) && (uVar7 == 0)) {
        info_local = (mpt_encode_state *)0xffffffffffffffef;
      }
      else {
        info_local = (mpt_encode_state *)0xffffffffffffffff;
      }
    }
    else if (((uVar7 < uVar2) || (uVar7 = uVar7 - uVar2, uVar7 < (uVar1 & 0xff))) ||
            (uVar7 < (uVar1 & 0xff))) {
      info_local = (mpt_encode_state *)0xffffffffffffffff;
    }
    else {
      pbStack_38 = (byte *)(uVar2 + (long)cobs->iov_base);
      if (base == (iovec *)0x0) {
        if ((uVar1 & 0xff) < uVar7) {
          if (left._7_1_ == 0) {
            if (uVar7 < 2) {
              return -0x11;
            }
            *pbStack_38 = 1;
            pbStack_38[1] = 0;
            tmp.iov_len = 2;
          }
          else {
            *pbStack_38 = left._7_1_;
            pbStack_38[uVar1 & 0xff] = 0;
            tmp.iov_len = (byte)(left._7_1_ + 1) + uVar2;
          }
          info->_ctx = 0;
          info->done = tmp.iov_len;
          info->scratch = 0;
          info_local = (mpt_encode_state *)0x0;
        }
        else {
          info_local = (mpt_encode_state *)0xffffffffffffffef;
        }
      }
      else {
        tmp.iov_len = base->iov_len;
        if (tmp.iov_len == 0) {
          info_local = (mpt_encode_state *)0xfffffffffffffffe;
        }
        else if ((uint8_t *)base->iov_base == (uint8_t *)0x0) {
          pvStack_68 = (void *)info->done;
          if (info->_ctx != 0) {
            tmp.iov_len = tmp.iov_len - 1;
          }
          pos = 0;
          do {
            if (tmp.iov_len == 0) {
              info->_ctx = 0;
              info->done = (size_t)pvStack_68;
              info->scratch = 0;
              return (ssize_t)pvStack_68;
            }
            tmp.iov_base = pvStack_68;
            tmp.iov_len = tmp.iov_len - 1;
            pvStack_68 = (void *)mpt_memrchr((iovec *)&pos,1,0);
          } while (-1 < (long)pvStack_68);
          info_local = (mpt_encode_state *)0xfffffffffffffffe;
        }
        else {
          if (left._7_1_ == 0) {
            left._7_1_ = 1;
            if (uVar7 < 2) {
              return -0x11;
            }
            len = uVar7 - 1;
          }
          else {
            len = uVar7 - (uVar1 & 0xff);
            if (len == 0) {
              return -0x11;
            }
          }
          pbStack_38 = pbStack_38 + (int)(uint)left._7_1_;
          dst = (uint8_t *)base->iov_base;
          do {
            sVar8 = tmp.iov_len - 1;
            if (tmp.iov_len == 0) {
              pbStack_38[(int)-(uint)left._7_1_] = left._7_1_;
              tmp.iov_len = 0;
              goto LAB_00116cf7;
            }
            if (*dst == 0) {
              pbStack_38[(int)-(uint)left._7_1_] = left._7_1_;
              left._7_1_ = 1;
              sVar5 = len - 1;
              bVar3 = left._7_1_;
              pbVar4 = pbStack_38 + 1;
            }
            else {
              *pbStack_38 = *dst;
              sVar5 = len - 1;
              bVar3 = left._7_1_ + 1;
              pbVar4 = pbStack_38 + 1;
              if ((byte)(left._7_1_ + 1) == 0xff) {
                if (sVar5 == 0) {
                  pbStack_38[(int)-(uint)left._7_1_] = left._7_1_;
                  len = sVar5;
                  goto LAB_00116cf7;
                }
                pbStack_38[-0xfe] = 0xff;
                left._7_1_ = 1;
                sVar5 = len - 2;
                bVar3 = left._7_1_;
                pbVar4 = pbStack_38 + 2;
              }
            }
            pbStack_38 = pbVar4;
            left._7_1_ = bVar3;
            len = sVar5;
            tmp.iov_len = sVar8;
            dst = dst + 1;
          } while (len != 0);
          pbStack_38[(int)-(uint)left._7_1_] = left._7_1_;
LAB_00116cf7:
          lVar6 = cobs->iov_len - len;
          info->_ctx = ((lVar6 - info->done) - info->scratch) + info->_ctx;
          info->done = lVar6 - (ulong)left._7_1_;
          info->scratch = (ulong)left._7_1_;
          info_local = (mpt_encode_state *)(base->iov_len - tmp.iov_len);
        }
      }
    }
  }
  return (ssize_t)info_local;
}

Assistant:

extern ssize_t mpt_encode_cobs(MPT_STRUCT(encode_state) *info, const struct iovec *cobs, const struct iovec *base)
#endif
{
	const uint8_t *src;
	uint8_t *dst, code;
	size_t left, len;
	
	if (!cobs) {
		info->_ctx = 0;
		info->done = 0;
		info->scratch = 0;
		return 0;
	}
	code = info->scratch;
	len  = info->done;
	left = cobs->iov_len;
	
	/* uninitialized target */
	if (!(dst = cobs->iov_base)) {
		if (code || len || left) {
			return MPT_ERROR(BadArgument);
		}
		return MPT_ERROR(MissingBuffer);
	}
	/* bad encoder state */
	if ((len > left)
	    || (code > (left -= len))
	    || (code > left)) {
		return MPT_ERROR(BadArgument);
	}
	dst += len;
	
	/* message termination */
	if (!base) {
		/* need enough data to save end */
		if (code >= left) {
			return MPT_ERROR(MissingBuffer);
		}
		/* special case: empty message */
		if (!code) {
			if (left < 2) {
				return MPT_ERROR(MissingBuffer);
			}
			/* '\x00\x00' not allowed in cobs data stream.
			 * Decoder consumes single encoded zero. */
			dst[0] = 1;
			dst[1] = 0;
			len = 2;
		}
		/* cobs message termination */
		else {
			*dst = code;
			dst[code++] = 0;
			len += code;
		}
		info->_ctx = 0;
		info->done = len;
		info->scratch = 0;
		
		return 0;
	}
	src = base->iov_base;
	len = base->iov_len;
	
	/* start priority data */
	if (!len) {
		return MPT_ERROR(BadValue);
	}
	/* message deletion */
	if (!src) {
		struct iovec tmp;
		ssize_t pos = info->done;
		
		/* message in progress */
		if (info->_ctx) {
			--len;
		}
		tmp.iov_base = (void *) src;
		while (len--) {
			tmp.iov_len  = pos;
			if ((pos = mpt_memrchr(&tmp, 1, 0)) < 0) {
				return MPT_ERROR(BadValue);
			}
		}
		info->_ctx = 0;
		info->done = pos;
		info->scratch = 0;
		
		/* save start of encoder state for next message */
		return pos;
	}
	
	/* remaining data in cobs */
	if (code) {
		if (!(left -= code)) return MPT_ERROR(MissingBuffer);
	} else {
		if (left <= (code = 1)) return MPT_ERROR(MissingBuffer);
		--left;
	}
	dst += code;
	
	while (1) {
		uint8_t curr;
		
		/* save COBS state */
		if (!len--) {
			dst[-code] = code;
			len = 0;
			break;
		}
		
		/* end of code block */
		if (!(curr = *src++)) {
			code = MPT_cobs_zero(code, dst, left, src, len);
		}
		else {
			*(dst++) = curr; --left;
			/* reached maximum length */
			if (++code == MPT_COBS_MAXLEN) {
				/* unable to save continuation state */
				if (!left) {
					--code; --dst;
					dst[-code] = code;
					++len; --src;
					break;
				}
				/* end of code block */
				dst[-code] = code;
				code = 1;
				dst++;
				left--;
			}
		}
		/* save current state */
		if (!left) {
			dst[-code] = code;
			break;
		}
	}
	
	/* update processed data */
	left = cobs->iov_len - left;
	info->_ctx += left - info->done - info->scratch;
	info->done = left - code;
	info->scratch = code;
	
	/* return consumed size */
	return base->iov_len - len;
}